

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O1

char * get_yanglint_dir(void)

{
  __uid_t __uid;
  int iVar1;
  passwd *ppVar2;
  size_t sVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  char *format;
  
  __uid = getuid();
  ppVar2 = getpwuid(__uid);
  if (ppVar2 == (passwd *)0x0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    pcVar4 = "Determining home directory failed (%s).";
  }
  else {
    pcVar6 = ppVar2->pw_dir;
    sVar3 = strlen(pcVar6);
    pcVar4 = (char *)malloc(sVar3 + 0xb);
    if (pcVar4 != (char *)0x0) {
      sprintf(pcVar4,"%s/%s",pcVar6,".yanglint");
      iVar1 = access(pcVar4,5);
      if (iVar1 != -1) {
        return pcVar4;
      }
      piVar5 = __errno_location();
      if (*piVar5 == 2) {
        yl_log('\0',"Configuration directory \"%s\" does not exist, creating it.",pcVar4);
        iVar1 = mkdir(pcVar4,0x1c0);
        if (iVar1 == 0) {
          return pcVar4;
        }
        if (*piVar5 == 0x11) {
          return pcVar4;
        }
        pcVar6 = strerror(*piVar5);
        format = "Configuration directory \"%s\" cannot be created (%s).";
      }
      else {
        pcVar6 = strerror(*piVar5);
        format = "Configuration directory \"%s\" exists but cannot be accessed (%s).";
      }
      yl_log('\x01',format,pcVar4,pcVar6);
      free(pcVar4);
      return (char *)0x0;
    }
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    pcVar4 = "Memory allocation failed (%s).";
  }
  yl_log('\x01',pcVar4,pcVar6);
  return (char *)0x0;
}

Assistant:

char *
get_yanglint_dir(void)
{
    int ret;
    struct passwd *pw;
    char *user_home, *yl_dir;

    if (!(pw = getpwuid(getuid()))) {
        YLMSG_E("Determining home directory failed (%s).", strerror(errno));
        return NULL;
    }
    user_home = pw->pw_dir;

    yl_dir = malloc(strlen(user_home) + 1 + strlen(YL_DIR) + 1);
    if (!yl_dir) {
        YLMSG_E("Memory allocation failed (%s).", strerror(errno));
        return NULL;
    }
    sprintf(yl_dir, "%s/%s", user_home, YL_DIR);

    ret = access(yl_dir, R_OK | X_OK);
    if (ret == -1) {
        if (errno == ENOENT) {
            /* directory does not exist */
            YLMSG_W("Configuration directory \"%s\" does not exist, creating it.", yl_dir);
            if (mkdir(yl_dir, 00700)) {
                if (errno != EEXIST) {
                    /* parallel execution, yay */
                    YLMSG_E("Configuration directory \"%s\" cannot be created (%s).", yl_dir, strerror(errno));
                    free(yl_dir);
                    return NULL;
                }
            }
        } else {
            YLMSG_E("Configuration directory \"%s\" exists but cannot be accessed (%s).", yl_dir, strerror(errno));
            free(yl_dir);
            return NULL;
        }
    }

    return yl_dir;
}